

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O3

void irr::executeBlit_TextureCopy_x_to_x(SBlitJob *job)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  u32 uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  u32 uVar10;
  void *pvVar11;
  float fVar12;
  float fVar13;
  
  if (job->stretch == true) {
    fVar12 = floorf((float)job->x_stretch * 262144.0 + 0.0);
    fVar13 = floorf((float)job->y_stretch * 262144.0 + 0.0);
    if (job->srcPixelMul == 2) {
      uVar6 = job->height;
      if (uVar6 != 0) {
        pvVar11 = job->src;
        pvVar2 = job->dst;
        iVar3 = job->srcPitch;
        uVar4 = job->width;
        uVar1 = job->dstPitch;
        iVar7 = 0;
        uVar10 = 0;
        do {
          if ((ulong)uVar4 != 0) {
            uVar5 = 0;
            iVar9 = 0;
            do {
              *(undefined2 *)((long)pvVar2 + uVar5 * 2) =
                   *(undefined2 *)
                    ((long)pvVar11 + (long)(iVar9 >> 0x12) * 2 + (long)(iVar7 >> 0x12) * (long)iVar3
                    );
              uVar5 = uVar5 + 1;
              iVar9 = iVar9 + (int)fVar12;
            } while (uVar4 != uVar5);
          }
          pvVar2 = (void *)((long)pvVar2 + (ulong)uVar1);
          uVar10 = uVar10 + 1;
          iVar7 = iVar7 + (int)fVar13;
        } while (uVar10 != uVar6);
      }
    }
    else if ((job->srcPixelMul == 4) && (uVar6 = job->height, uVar6 != 0)) {
      pvVar11 = job->src;
      pvVar2 = job->dst;
      uVar5 = (ulong)job->width;
      iVar3 = 0;
      uVar4 = 0;
      do {
        iVar7 = (int)uVar5;
        uVar5 = 0;
        if (iVar7 != 0) {
          iVar7 = job->srcPitch;
          uVar8 = 0;
          iVar9 = 0;
          do {
            *(undefined4 *)((long)pvVar2 + uVar8 * 4) =
                 *(undefined4 *)
                  ((long)pvVar11 + (long)(iVar9 >> 0x12) * 4 + (long)(iVar3 >> 0x12) * (long)iVar7);
            uVar8 = uVar8 + 1;
            iVar9 = iVar9 + (int)fVar12;
            uVar5 = (ulong)job->width;
          } while (uVar8 < uVar5);
          uVar6 = job->height;
        }
        pvVar2 = (void *)((long)pvVar2 + (ulong)job->dstPitch);
        uVar4 = uVar4 + 1;
        iVar3 = iVar3 + (int)fVar13;
      } while (uVar4 < uVar6);
    }
  }
  else if (job->height != 0) {
    uVar6 = job->dstPixelMul;
    uVar10 = job->width;
    pvVar11 = job->src;
    pvVar2 = job->dst;
    uVar4 = 0;
    do {
      memcpy(pvVar2,pvVar11,(ulong)(uVar6 * uVar10));
      pvVar11 = (void *)((long)pvVar11 + (long)job->srcPitch);
      pvVar2 = (void *)((long)pvVar2 + (ulong)job->dstPitch);
      uVar4 = uVar4 + 1;
    } while (uVar4 < job->height);
  }
  return;
}

Assistant:

static void executeBlit_TextureCopy_x_to_x(const SBlitJob *job)
{
	if (job->stretch) {
		const f18 wscale = f32_to_f18(job->x_stretch);
		const f18 hscale = f32_to_f18(job->y_stretch);

		f18 src_y = f18_zero;

		if (job->srcPixelMul == 4) {
			const u32 *src = (u32 *)(job->src);
			u32 *dst = (u32 *)(job->dst);

			for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
				src = (u32 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));

				f18 src_x = f18_zero;
				for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
					dst[dx] = src[f18_floor(src_x)];
				}
				dst = (u32 *)((u8 *)(dst) + job->dstPitch);
			}
		} else if (job->srcPixelMul == 2) {
			const u16 *src = (u16 *)(job->src);
			u16 *dst = (u16 *)(job->dst);

			for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
				src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));

				f18 src_x = f18_zero;
				for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
					dst[dx] = src[f18_floor(src_x)];
				}
				dst = (u16 *)((u8 *)(dst) + job->dstPitch);
			}
		}
	} else {
		const size_t widthPitch = job->width * job->dstPixelMul;
		const void *src = (void *)job->src;
		void *dst = (void *)job->dst;

		for (u32 dy = 0; dy < job->height; ++dy) {
			memcpy(dst, src, widthPitch);

			src = (void *)((u8 *)(src) + job->srcPitch);
			dst = (void *)((u8 *)(dst) + job->dstPitch);
		}
	}
}